

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int __thiscall
opengv::relative_pose::modules::Ge_step::operator()(Ge_step *this,VectorXd *x,VectorXd *fvec)

{
  double *pdVar1;
  cayley_t cayley;
  Matrix<double,_1,_3,_1,_1,_3> jacobian;
  cayley_t local_48;
  Matrix<double,_1,_3,_1,_1,_3> local_28;
  
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *pdVar1;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar1[1];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar1[2];
  ge::getCostWithJacobian
            (this->_xxF,this->_yyF,this->_zzF,this->_xyF,this->_yzF,this->_zxF,this->_x1P,this->_y1P
             ,this->_z1P,this->_x2P,this->_y2P,this->_z2P,this->_m11P,this->_m12P,this->_m22P,
             &local_48,&local_28,1);
  pdVar1 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  *pdVar1 = local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[0];
  pdVar1[1] = local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
              .array[1];
  pdVar1[2] = local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
              .array[2];
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
  {
    cayley_t cayley = x;
    Eigen::Matrix<double,1,3> jacobian;
    ge::getCostWithJacobian(
        _xxF,_yyF,_zzF,_xyF,_yzF,_zxF,
        _x1P,_y1P,_z1P,_x2P,_y2P,_z2P,_m11P,_m12P,_m22P,cayley,jacobian,1);

    fvec[0] = jacobian(0,0);
    fvec[1] = jacobian(0,1);
    fvec[2] = jacobian(0,2);
    
    return 0;
  }